

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_search.c
# Opt level: O1

int ngram_search_step(ps_search_t *search,int frame_idx)

{
  int *piVar1;
  ps_config_t **pppVar2;
  uint16 uVar3;
  short sVar4;
  s3ssid_t sVar5;
  ps_latnode_t **pppVar6;
  bitvec_t *pbVar7;
  ps_search_t *ppVar8;
  dictword_t *pdVar9;
  char *pcVar10;
  dict2pid_t *pdVar11;
  hmm_t *phVar12;
  ps_latnode_s *ppVar13;
  bin_mdef_t *pbVar14;
  ps_search_t *ppVar15;
  s3cipid_t *psVar16;
  dict2pid_t *pdVar17;
  bool bVar18;
  hmm_t *phVar19;
  int iVar20;
  int32 iVar21;
  uint uVar22;
  int32 iVar23;
  int iVar24;
  uint uVar25;
  dict_t *pdVar26;
  int32 *piVar27;
  int16 *piVar28;
  ps_lattice_t *ppVar29;
  uint uVar30;
  undefined8 *puVar31;
  ulong uVar32;
  uint *puVar33;
  undefined4 *puVar34;
  int iVar35;
  uint uVar36;
  long lVar37;
  ngram_search_t *pnVar38;
  long lVar39;
  uint uVar40;
  int score;
  long *plVar41;
  acmod_t *paVar42;
  ngram_search_t *ngs;
  ps_latnode_t *ppVar43;
  long lVar44;
  int iVar45;
  ps_searchfuncs_t *ppVar46;
  int iVar47;
  chan_s *pcVar48;
  int *piVar49;
  hmm_t *phVar50;
  hmm_t *phVar51;
  ulong uVar52;
  bptbl_t *pbVar53;
  uint *puVar54;
  chan_t *pcVar55;
  xwdssid_t *pxVar56;
  acmod_t *paVar57;
  ps_latlink_t *ppVar58;
  long lVar59;
  chan_s *h;
  ps_searchfuncs_t *ppStack_490;
  undefined8 *puStack_480;
  uint uStack_46c;
  uint *puStack_468;
  ulong uStack_460;
  ps_searchfuncs_t *ppStack_458;
  ulong uStack_450;
  uint *puStack_448;
  ulong uStack_440;
  int32 aiStack_438 [226];
  code *pcStack_b0;
  ngram_search_t *pnStack_a0;
  uint uStack_94;
  dict_t *pdStack_90;
  int iStack_88;
  float32 fStack_84;
  long lStack_80;
  int iStack_74;
  ulong uStack_70;
  int *piStack_68;
  dict2pid_t *pdStack_60;
  int32 *piStack_58;
  ulong uStack_50;
  int iStack_44;
  ulong uStack_40;
  int32 iStack_34;
  
  if (*(char *)&search[1].name == '\0') {
    if (*(char *)((long)&search[1].name + 1) == '\0') {
      return -1;
    }
    pnStack_a0 = (ngram_search_t *)search;
    uStack_94 = frame_idx;
    if (search->acmod->compallsen == '\0') {
      pcStack_b0 = (code *)0x1388e9;
      acmod_clear_active(search->acmod);
      iVar20 = pnStack_a0->n_active_word[frame_idx & 1U];
      if (0 < iVar20) {
        piVar49 = pnStack_a0->active_word_list[frame_idx & 1U];
        iVar47 = 0;
        do {
          pcVar55 = pnStack_a0->word_chan[*piVar49];
          do {
            if ((pcVar55->hmm).frame == frame_idx) {
              pcStack_b0 = (code *)0x13893b;
              acmod_activate_hmm((pnStack_a0->base).acmod,&pcVar55->hmm);
            }
            pcVar55 = pcVar55->next;
          } while (pcVar55 != (chan_s *)0x0);
          piVar49 = piVar49 + 1;
          iVar47 = iVar47 + 1;
        } while (iVar47 != iVar20);
      }
    }
    pnVar38 = pnStack_a0;
    pcStack_b0 = (code *)0x138966;
    pdVar26 = (dict_t *)acmod_score((pnStack_a0->base).acmod,(int *)&uStack_94);
    piVar27 = &(pnVar38->st).n_senone_active_utt;
    *piVar27 = *piVar27 + ((pnVar38->base).acmod)->n_senone_active;
    pcStack_b0 = (code *)0x138981;
    ngram_search_mark_bptable(pnVar38,uStack_94);
    iVar20 = 0;
    if (-0x20000000 < pnVar38->best_score) {
      if (pnVar38->best_score + pnVar38->beam * 2 < -0x20000000) {
        iVar47 = 0;
        pcStack_b0 = (code *)0x1389d7;
        pdStack_90 = pdVar26;
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdflat.c"
                ,0x345,"Renormalizing Scores at frame %d, best score %d\n",(ulong)uStack_94);
        uVar40 = uStack_94;
        iVar20 = pnVar38->n_active_word[uStack_94 & 1];
        if (0 < iVar20) {
          iVar23 = pnStack_a0->best_score;
          piVar49 = pnStack_a0->active_word_list[uStack_94 & 1];
          do {
            pcVar55 = pnStack_a0->word_chan[*piVar49];
            do {
              if ((pcVar55->hmm).frame == uVar40) {
                pcStack_b0 = (code *)0x138a2a;
                hmm_normalize(&pcVar55->hmm,iVar23);
              }
              pcVar55 = pcVar55->next;
            } while (pcVar55 != (chan_s *)0x0);
            piVar49 = piVar49 + 1;
            iVar47 = iVar47 + 1;
          } while (iVar47 != iVar20);
        }
        pnStack_a0->renormalized = 1;
        pdVar26 = pdStack_90;
        pnVar38 = pnStack_a0;
      }
      uVar40 = uStack_94;
      pnVar38->best_score = -0x20000000;
      pnVar38->hmmctx->senscore = (int16 *)pdVar26;
      iVar20 = pnVar38->n_active_word[uStack_94 & 1];
      piVar49 = pnVar38->active_word_list[uStack_94 & 1];
      piVar27 = &(pnVar38->st).n_fwdflat_words;
      *piVar27 = *piVar27 + iVar20;
      pdStack_90 = (dict_t *)CONCAT44(pdStack_90._4_4_,iVar20);
      iVar23 = -0x20000000;
      iVar47 = -0x20000000;
      if (0 < iVar20) {
        iVar20 = 0;
LAB_00138a96:
        iVar35 = *piVar49;
        pcVar48 = pnVar38->word_chan[iVar35];
        pnVar38 = pnStack_a0;
        if ((pcVar48->hmm).frame != uVar40) goto LAB_00138add;
        pcStack_b0 = (code *)0x138ab5;
        iVar21 = hmm_vit_eval(&pcVar48->hmm);
        pnVar38 = pnStack_a0;
        if ((iVar47 < iVar21) && (iVar23 = iVar47, iVar35 != (pnStack_a0->base).finish_wid)) {
          iVar47 = iVar21;
          iVar23 = iVar21;
        }
        do {
          piVar27 = &(pnVar38->st).n_fwdflat_chan;
          *piVar27 = *piVar27 + 1;
LAB_00138add:
          do {
            pcVar48 = pcVar48->next;
            if (pcVar48 == (chan_s *)0x0) {
              piVar49 = piVar49 + 1;
              iVar20 = iVar20 + 1;
              if (iVar20 == (uint)pdStack_90) goto LAB_00138b0b;
              goto LAB_00138a96;
            }
          } while ((pcVar48->hmm).frame != uVar40);
          pcStack_b0 = (code *)0x138af4;
          iVar21 = hmm_vit_eval(&pcVar48->hmm);
          bVar18 = iVar47 < iVar21;
          iVar47 = iVar23;
          if (bVar18) {
            iVar47 = iVar21;
            iVar23 = iVar21;
          }
        } while( true );
      }
LAB_00138b0b:
      uVar40 = uStack_94;
      pnVar38->best_score = iVar47;
      iVar47 = pnVar38->n_active_word[uStack_94 & 1];
      piVar49 = pnVar38->active_word_list[uStack_94 & 1];
      iVar35 = (pnVar38->base).n_words;
      iVar20 = iVar35 + 0x1f;
      iVar35 = iVar35 + 0x3e;
      if (-1 < iVar20) {
        iVar35 = iVar20;
      }
      iVar20 = 0;
      pcStack_b0 = (code *)0x138b58;
      memset(pnVar38->word_active,0,(long)(iVar35 >> 5) << 2);
      pdStack_60 = (dict2pid_t *)CONCAT44(pdStack_60._4_4_,iVar47);
      if (0 < iVar47) {
        iVar47 = uVar40 + 1;
        fStack_84 = (float32)pnStack_a0->pip;
        iVar35 = pnStack_a0->fwdflatbeam + pnStack_a0->best_score;
        iStack_88 = pnStack_a0->best_score + pnStack_a0->fwdflatwbeam;
        do {
          uStack_70 = CONCAT44(uStack_70._4_4_,iVar20);
          iVar20 = *piVar49;
          lStack_80 = (long)iVar20;
          pcVar55 = pnStack_a0->word_chan[lStack_80];
          piStack_68 = piVar49;
          if (((pcVar55->hmm).frame == uVar40) && (iVar35 < (pcVar55->hmm).bestscore)) {
            (pcVar55->hmm).frame = iVar47;
            iVar45 = iVar20 + 0x1f;
            if (-1 < iVar20) {
              iVar45 = iVar20;
            }
            pnStack_a0->word_active[iVar45 >> 5] =
                 pnStack_a0->word_active[iVar45 >> 5] | 1 << ((byte)iVar20 & 0x1f);
            iVar45 = (pcVar55->hmm).out_score;
            pcVar48 = pcVar55->next;
            iVar24 = ((pnStack_a0->base).dict)->word[lStack_80].pronlen;
            if (pcVar48 == (chan_s *)0x0) {
              if (iVar24 != 1) {
                pcStack_b0 = ngram_fwdflat_finish;
                __assert_fail("dict_is_single_phone(ps_search_dict(ngs), w)",
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdflat.c"
                              ,0x21c,"void fwdflat_prune_chan(ngram_search_t *, int)");
              }
              if (iStack_88 < iVar45) {
                pcStack_b0 = (code *)0x138c8a;
                ngram_search_save_bp(pnStack_a0,uVar40,iVar20,iVar45,(pcVar55->hmm).out_history,0);
              }
            }
            else {
              if (iVar24 == 1) {
                pcStack_b0 = (code *)0x13943a;
                __assert_fail("!dict_is_single_phone(ps_search_dict(ngs), w)",
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdflat.c"
                              ,0x202,"void fwdflat_prune_chan(ngram_search_t *, int)");
              }
              iVar45 = iVar45 + (int)fStack_84;
              if (iVar35 < iVar45) {
                if ((pcVar48->info).penult_phn_wid < 0) {
                  if (((pcVar48->hmm).frame < (int)uVar40) || ((pcVar48->hmm).score[0] < iVar45)) {
                    pcStack_b0 = (code *)0x138ca9;
                    hmm_enter(&pcVar48->hmm,iVar45,(pcVar55->hmm).out_history,iVar47);
                  }
                }
                else {
                  do {
                    if (((pcVar48->hmm).frame < (int)uVar40) || ((pcVar48->hmm).score[0] < iVar45))
                    {
                      pcStack_b0 = (code *)0x138c50;
                      hmm_enter(&pcVar48->hmm,iVar45,(pcVar55->hmm).out_history,iVar47);
                    }
                    pcVar48 = pcVar48->next;
                  } while (pcVar48 != (chan_s *)0x0);
                }
              }
            }
          }
          pcVar48 = pcVar55->next;
          if (pcVar48 != (chan_s *)0x0) {
            pdStack_90 = (dict_t *)CONCAT44(pdStack_90._4_4_,1 << ((byte)lStack_80 & 0x1f));
            iVar20 = (int)lStack_80;
            iVar45 = iVar20 + 0x1f;
            if (-1 < iVar20) {
              iVar45 = iVar20;
            }
            piStack_58 = (int32 *)(long)(iVar45 >> 5);
            do {
              iVar20 = (pcVar48->hmm).frame;
              if ((int)uVar40 <= iVar20) {
                if (iVar35 < (pcVar48->hmm).bestscore) {
                  (pcVar48->hmm).frame = iVar47;
                  pnStack_a0->word_active[(long)piStack_58] =
                       pnStack_a0->word_active[(long)piStack_58] | (uint)pdStack_90;
                  iVar20 = (pcVar48->hmm).out_score;
                  if ((pcVar48->info).penult_phn_wid < 0) {
                    iVar20 = iVar20 + (int)fStack_84;
                    if (iVar35 < iVar20) {
                      h = pcVar48->next;
                      if ((h->info).penult_phn_wid < 0) {
                        if (((h->hmm).frame < (int)uVar40) || ((h->hmm).score[0] < iVar20)) {
                          pcStack_b0 = (code *)0x138dba;
                          hmm_enter(&h->hmm,iVar20,(pcVar48->hmm).out_history,iVar47);
                        }
                      }
                      else {
                        for (; h != (chan_s *)0x0; h = h->next) {
                          if (((h->hmm).frame < (int)uVar40) || ((h->hmm).score[0] < iVar20)) {
                            pcStack_b0 = (code *)0x138d92;
                            hmm_enter(&h->hmm,iVar20,(pcVar48->hmm).out_history,iVar47);
                          }
                        }
                      }
                    }
                  }
                  else if (iStack_88 < iVar20) {
                    pcStack_b0 = (code *)0x138d45;
                    ngram_search_save_bp
                              (pnStack_a0,uVar40,(int32)lStack_80,iVar20,(pcVar48->hmm).out_history,
                               (pcVar48->info).penult_phn_wid);
                  }
                }
                else if (iVar20 != iVar47) {
                  pcStack_b0 = (code *)0x138d53;
                  hmm_clear_scores(&pcVar48->hmm);
                }
              }
              pcVar48 = pcVar48->next;
            } while (pcVar48 != (chan_s *)0x0);
          }
          piVar49 = piStack_68 + 1;
          iVar20 = (int)uStack_70 + 1;
        } while (iVar20 != (int)pdStack_60);
      }
      uVar40 = uStack_94;
      pnVar38 = pnStack_a0;
      piVar49 = (int *)(long)(int)uStack_94;
      uStack_50 = (ulong)uStack_94;
      pdStack_90 = (pnStack_a0->base).dict;
      pdStack_60 = (pnStack_a0->base).d2p;
      iStack_88 = pnStack_a0->pip;
      fStack_84 = pnStack_a0->fwdflat_fwdtree_lw_ratio;
      lStack_80 = CONCAT44(lStack_80._4_4_,pnStack_a0->fwdflatbeam + pnStack_a0->best_score);
      if (pnStack_a0->fwdtree != '\0') {
        uVar36 = uStack_94 - pnStack_a0->max_sf_win;
        if ((int)uVar36 < 1) {
          uVar36 = 0;
        }
        uVar22 = pnStack_a0->max_sf_win + uStack_94;
        iVar20 = (pnStack_a0->base).n_words;
        uVar25 = pnStack_a0->n_frame;
        if ((int)uVar22 < pnStack_a0->n_frame) {
          uVar25 = uVar22;
        }
        iVar47 = iVar20 + 0x1f;
        iVar20 = iVar20 + 0x3e;
        if (-1 < iVar47) {
          iVar20 = iVar47;
        }
        pcStack_b0 = (code *)0x138e7c;
        memset(pnStack_a0->expand_word_flag,0,(long)(iVar20 >> 5) << 2);
        pnVar38->n_expand_words = 0;
        if ((int)uVar36 < (int)uVar25) {
          pppVar6 = pnStack_a0->frm_wordlist;
          uVar32 = (ulong)uVar36;
          do {
            ppVar43 = pppVar6[uVar32];
            if (ppVar43 != (ps_latnode_t *)0x0) {
              pbVar7 = pnStack_a0->expand_word_flag;
              do {
                uVar36 = ppVar43->wid;
                uVar22 = uVar36 + 0x1f;
                if (-1 < (int)uVar36) {
                  uVar22 = uVar36;
                }
                if ((pbVar7[(int)uVar22 >> 5] >> (uVar36 & 0x1f) & 1) == 0) {
                  iVar20 = pnStack_a0->n_expand_words;
                  pnStack_a0->n_expand_words = iVar20 + 1;
                  pnStack_a0->expand_word_list[iVar20] = uVar36;
                  iVar20 = ppVar43->wid;
                  iVar47 = iVar20 + 0x1f;
                  if (-1 < iVar20) {
                    iVar47 = iVar20;
                  }
                  puVar54 = pbVar7 + (iVar47 >> 5);
                  *puVar54 = *puVar54 | 1 << ((byte)iVar20 & 0x1f);
                }
                ppVar43 = ppVar43->next;
              } while (ppVar43 != (ps_latnode_s *)0x0);
            }
            uVar32 = uVar32 + 1;
          } while (uVar32 != uVar25);
        }
        pnStack_a0->expand_word_list[pnStack_a0->n_expand_words] = -1;
      }
      iStack_74 = uVar40 + 1;
      piVar27 = &(pnStack_a0->st).n_fwdflat_word_transition;
      *piVar27 = *piVar27 + pnStack_a0->n_expand_words;
      uVar32 = (ulong)pnStack_a0->bp_table_idx[(long)piVar49];
      pnVar38 = pnStack_a0;
      if (pnStack_a0->bp_table_idx[(long)piVar49] < pnStack_a0->bpidx) {
        uVar52 = 0;
        iVar20 = -0x20000000;
        piStack_68 = piVar49;
        do {
          pbVar53 = pnVar38->bp_table;
          pnVar38->word_lat_idx[pbVar53[uVar32].wid] = -1;
          if (pbVar53[uVar32].wid != (pnVar38->base).finish_wid) {
            if ((long)pbVar53[uVar32].last2_phone == -1) {
              pxVar56 = (xwdssid_t *)0x0;
            }
            else {
              pxVar56 = pdStack_60->rssid[pbVar53[uVar32].last_phone] + pbVar53[uVar32].last2_phone;
            }
            piStack_58 = pnVar38->bscore_stack + pbVar53[uVar32].s_idx;
            piVar49 = pnVar38->expand_word_list;
            uStack_70 = uVar32;
            iStack_44 = iVar20;
            uStack_40 = uVar52;
            if (-1 < *piVar49) {
              lVar37 = 4;
              do {
                iVar20 = *piVar49;
                piVar27 = &pbVar53[uVar32].score;
                if (pxVar56 != (xwdssid_t *)0x0) {
                  piVar27 = piStack_58 + pxVar56->cimap[*pdStack_90->word[iVar20].ciphone];
                }
                iVar47 = *piVar27;
                if (iVar47 != -0x20000000) {
                  pcStack_b0 = (code *)0x13907d;
                  iVar23 = ngram_tg_score(pnStack_a0->lmset,pdStack_90->word[iVar20].basewid,
                                          pbVar53[uVar32].real_wid,pbVar53[uVar32].prev_real_wid,
                                          &iStack_34);
                  iVar47 = (int)((float)iVar47 + (float)(iVar23 >> 10) * (float)fStack_84) +
                           iStack_88;
                  if (((int)lStack_80 < iVar47) &&
                     ((pcVar55 = pnStack_a0->word_chan[iVar20],
                      (pcVar55->hmm).frame < (int)piStack_68 || ((pcVar55->hmm).score[0] < iVar47)))
                     ) {
                    pcStack_b0 = (code *)0x1390de;
                    hmm_enter(&pcVar55->hmm,iVar47,(int32)uStack_70,iStack_74);
                    uVar3 = pdStack_60->ldiph_lc[(short)pcVar55->ciphone]
                            [*(short *)((long)&pcVar55->ciphone + 2)]
                            [pdStack_90->word[pbVar53[uVar32].wid].ciphone
                             [(long)pdStack_90->word[pbVar53[uVar32].wid].pronlen + -1]];
                    (pcVar55->hmm).senid[0] = uVar3;
                    if (uVar3 == 0xffff) {
                      pcStack_b0 = (code *)0x13941b;
                      __assert_fail("IS_S3SSID(hmm_mpx_ssid(&rhmm->hmm, 0))",
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdflat.c"
                                    ,0x2d0,"void fwdflat_word_transition(ngram_search_t *, int)");
                    }
                    iVar47 = iVar20 + 0x1f;
                    if (-1 < iVar20) {
                      iVar47 = iVar20;
                    }
                    pnStack_a0->word_active[iVar47 >> 5] =
                         pnStack_a0->word_active[iVar47 >> 5] | 1 << ((byte)iVar20 & 0x1f);
                  }
                }
                piVar49 = (int *)((long)pnStack_a0->expand_word_list + lVar37);
                piVar1 = (int *)((long)pnStack_a0->expand_word_list + lVar37);
                lVar37 = lVar37 + 4;
                pnVar38 = pnStack_a0;
              } while (-1 < *piVar1);
            }
            if (pxVar56 == (xwdssid_t *)0x0) {
              piVar27 = &pbVar53[uVar32].score;
            }
            else {
              piVar27 = piStack_58 + pxVar56->cimap[((pnVar38->base).acmod)->mdef->sil];
            }
            iVar47 = *piVar27;
            uVar52 = uStack_40;
            if (iStack_44 < iVar47) {
              uVar52 = uStack_70;
            }
            uVar52 = uVar52 & 0xffffffff;
            uVar32 = uStack_70;
            piVar49 = piStack_68;
            iVar20 = iStack_44;
            if (iStack_44 < iVar47) {
              iVar20 = iVar47;
            }
          }
          uVar40 = (uint)piVar49;
          uVar32 = uVar32 + 1;
        } while ((long)uVar32 < (long)pnVar38->bpidx);
      }
      else {
        iVar20 = -0x20000000;
        uVar52 = 0;
      }
      iVar20 = iVar20 + iStack_88;
      iVar47 = pnVar38->silpen + iVar20;
      if (-0x20000000 < iVar47 && (int)lStack_80 < iVar47) {
        iVar35 = (pnVar38->base).silence_wid;
        pcVar55 = pnVar38->word_chan[iVar35];
        if (((pcVar55->hmm).frame < (int)uStack_50) || ((pcVar55->hmm).score[0] < iVar47)) {
          pcStack_b0 = (code *)0x13922a;
          hmm_enter(&pcVar55->hmm,iVar47,(int32)uVar52,iStack_74);
          iVar47 = iVar35 + 0x1f;
          if (-1 < iVar35) {
            iVar47 = iVar35;
          }
          pnVar38->word_active[iVar47 >> 5] =
               pnVar38->word_active[iVar47 >> 5] | 1 << ((byte)iVar35 & 0x1f);
        }
      }
      iVar20 = iVar20 + pnVar38->fillpen;
      uVar36 = (uint)uStack_50;
      if ((-0x20000000 < iVar20 && (int)lStack_80 < iVar20) &&
         (iVar47 = pdStack_90->filler_start, iVar47 <= pdStack_90->filler_end)) {
        lVar37 = (long)iVar47 + -1;
        uVar32 = uStack_50;
        do {
          if (((iVar47 != (pnVar38->base).silence_wid) &&
              (pcVar55 = pnVar38->word_chan[lVar37 + 1], pcVar55 != (chan_t *)0x0)) &&
             (((pcVar55->hmm).frame < (int)uVar32 || ((pcVar55->hmm).score[0] < iVar20)))) {
            pcStack_b0 = (code *)0x1392bb;
            hmm_enter(&pcVar55->hmm,iVar20,(int32)uVar52,iStack_74);
            iVar35 = iVar47 + 0x1f;
            if (-1 < iVar47) {
              iVar35 = iVar47;
            }
            pnVar38->word_active[iVar35 >> 5] =
                 pnVar38->word_active[iVar35 >> 5] | 1 << ((byte)iVar47 & 0x1f);
            uVar32 = uStack_50;
          }
          uVar36 = (uint)uVar32;
          lVar37 = lVar37 + 1;
          iVar47 = iVar47 + 1;
        } while (lVar37 < pdStack_90->filler_end);
      }
      iVar20 = pnVar38->n_active_word[uVar36 & 1];
      if (0 < iVar20) {
        piVar27 = pnVar38->active_word_list[uVar36 & 1];
        lVar37 = 0;
        do {
          if ((pnVar38->word_chan[piVar27[lVar37]]->hmm).frame == uVar40) {
            pcStack_b0 = (code *)0x139331;
            hmm_clear_scores(&pnVar38->word_chan[piVar27[lVar37]]->hmm);
          }
          lVar37 = lVar37 + 1;
        } while (iVar20 != (int)lVar37);
      }
      puVar54 = (uint *)pnVar38->fwdflat_wordlist;
      puVar33 = (uint *)pnVar38->active_word_list[~uStack_94 & 1];
      uVar40 = *puVar54;
      if ((int)uVar40 < 0) {
        iVar20 = 0;
      }
      else {
        pbVar7 = pnVar38->word_active;
        iVar20 = 0;
        do {
          puVar54 = puVar54 + 1;
          if (((pbVar7[uVar40 >> 5] >> (uVar40 & 0x1f) & 1) != 0) &&
             ((int)uVar40 < (pnVar38->base).start_wid)) {
            *puVar33 = uVar40;
            puVar33 = puVar33 + 1;
            iVar20 = iVar20 + 1;
          }
          uVar40 = *puVar54;
        } while (-1 < (int)uVar40);
      }
      uVar40 = (pnVar38->base).start_wid;
      if ((int)uVar40 < (pnVar38->base).n_words) {
        pbVar7 = pnVar38->word_active;
        do {
          uVar36 = uVar40 + 0x1f;
          if (-1 < (int)uVar40) {
            uVar36 = uVar40;
          }
          if ((pbVar7[(int)uVar36 >> 5] >> (uVar40 & 0x1f) & 1) != 0) {
            *puVar33 = uVar40;
            puVar33 = puVar33 + 1;
            iVar20 = iVar20 + 1;
          }
          uVar40 = uVar40 + 1;
        } while ((int)uVar40 < (pnVar38->base).n_words);
      }
      if (pnVar38->fwdtree == '\0') {
        pnVar38->n_frame = pnVar38->n_frame + 1;
      }
      pnVar38->n_active_word[~uStack_94 & 1] = iVar20;
      iVar20 = 1;
    }
    return iVar20;
  }
  uStack_46c = frame_idx;
  if (search->acmod->compallsen == '\0') {
    acmod_clear_active(search->acmod);
    iVar20 = *(int *)((long)&search[1].d2p + 4);
    if (0 < iVar20) {
      phVar50 = (hmm_t *)search[1].dict;
      iVar20 = iVar20 + 1;
      do {
        if (phVar50->frame == frame_idx) {
          acmod_activate_hmm(search->acmod,phVar50);
        }
        phVar50 = (hmm_t *)(phVar50[1].score + 4);
        iVar20 = iVar20 + -1;
      } while (1 < iVar20);
    }
    uVar32 = (ulong)(frame_idx & 1);
    iVar20 = *(int *)((long)&search[2].name + uVar32 * 4);
    if (0 < iVar20) {
      puVar31 = *(undefined8 **)(search[2].type + uVar32 * 8);
      iVar20 = iVar20 + 1;
      do {
        phVar50 = (hmm_t *)*puVar31;
        puVar31 = puVar31 + 1;
        acmod_activate_hmm(search->acmod,phVar50);
        iVar20 = iVar20 + -1;
      } while (1 < iVar20);
    }
    iVar20 = *(int *)((long)&search[2].config + uVar32 * 4);
    if (0 < iVar20) {
      ppVar46 = (&(search[2].pls)->vt)[uVar32];
      do {
        for (phVar50 = (hmm_t *)(&(search[1].last_link)->from)[*(int *)&ppVar46->start];
            phVar50 != (hmm_t *)0x0; phVar50 = (hmm_t *)phVar50[1].ctx) {
          acmod_activate_hmm(search->acmod,phVar50);
        }
        ppVar46 = (ps_searchfuncs_t *)((long)&ppVar46->start + 4);
        bVar18 = 1 < iVar20;
        iVar20 = iVar20 + -1;
      } while (bVar18);
    }
    if (0 < *(int *)&search[2].vt) {
      lVar37 = 0;
      do {
        phVar50 = (hmm_t *)(&(search[1].last_link)->from)
                           [*(int *)(*(long *)&search[1].finish_wid + lVar37 * 4)];
        if (phVar50->frame == frame_idx) {
          acmod_activate_hmm(search->acmod,phVar50);
        }
        lVar37 = lVar37 + 1;
      } while (lVar37 < *(int *)&search[2].vt);
    }
  }
  piVar28 = acmod_score(search->acmod,(int *)&uStack_46c);
  iVar20 = 0;
  if (piVar28 != (int16 *)0x0) {
    *(int *)&search[4].pls = *(int *)&search[4].pls + search->acmod->n_senone_active;
    ngram_search_mark_bptable((ngram_search_t *)search,uStack_46c);
    iVar20 = 0;
    if (-0x20000000 < *(int *)&search[3].last_link) {
      if (*(int *)&search[3].last_link + search[5].n_words * 2 < -0x20000000) {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                ,0x5c5,"Renormalizing Scores at frame %d, best score %d\n",(ulong)uStack_46c);
        uVar40 = uStack_46c;
        iVar20 = *(int *)((long)&search[1].d2p + 4);
        iVar23 = *(int32 *)&search[3].last_link;
        if (0 < iVar20) {
          phVar50 = (hmm_t *)search[1].dict;
          iVar20 = iVar20 + 1;
          do {
            if (phVar50->frame == uVar40) {
              hmm_normalize(phVar50,iVar23);
            }
            phVar50 = (hmm_t *)(phVar50[1].score + 4);
            iVar20 = iVar20 + -1;
          } while (1 < iVar20);
        }
        uVar32 = (ulong)(uVar40 & 1);
        iVar20 = *(int *)((long)&search[2].name + uVar32 * 4);
        if (0 < iVar20) {
          puVar31 = *(undefined8 **)(search[2].type + uVar32 * 8);
          iVar20 = iVar20 + 1;
          do {
            phVar50 = (hmm_t *)*puVar31;
            puVar31 = puVar31 + 1;
            hmm_normalize(phVar50,iVar23);
            iVar20 = iVar20 + -1;
          } while (1 < iVar20);
        }
        iVar20 = *(int *)((long)&search[2].config + uVar32 * 4);
        if (0 < iVar20) {
          ppVar46 = (&(search[2].pls)->vt)[uVar32];
          do {
            for (phVar50 = (hmm_t *)(&(search[1].last_link)->from)[*(int *)&ppVar46->start];
                phVar50 != (hmm_t *)0x0; phVar50 = (hmm_t *)phVar50[1].ctx) {
              hmm_normalize(phVar50,iVar23);
            }
            ppVar46 = (ps_searchfuncs_t *)((long)&ppVar46->start + 4);
            bVar18 = 1 < iVar20;
            iVar20 = iVar20 + -1;
          } while (bVar18);
        }
        if (0 < *(int *)&search[2].vt) {
          lVar37 = 0;
          do {
            phVar50 = (hmm_t *)(&(search[1].last_link)->from)
                               [*(int *)(*(long *)&search[1].finish_wid + lVar37 * 4)];
            if (phVar50->frame == uVar40) {
              hmm_normalize(phVar50,iVar23);
            }
            lVar37 = lVar37 + 1;
          } while (lVar37 < *(int *)&search[2].vt);
        }
        search[3].post = 1;
      }
      uVar40 = uStack_46c;
      *(int16 **)(search[1].type + 0x10) = piVar28;
      iVar20 = *(int *)((long)&search[1].d2p + 4);
      iVar35 = -0x20000000;
      iVar47 = -0x20000000;
      if (0 < iVar20) {
        phVar50 = (hmm_t *)search[1].dict;
        iVar20 = iVar20 + 1;
        do {
          if (phVar50->frame == uVar40) {
            iVar23 = hmm_vit_eval(phVar50);
            if (iVar47 < iVar23) {
              iVar47 = iVar23;
            }
            search[3].finish_wid = search[3].finish_wid + 1;
          }
          phVar50 = (hmm_t *)(phVar50[1].score + 4);
          iVar20 = iVar20 + -1;
        } while (1 < iVar20);
      }
      *(int *)&search[3].last_link = iVar47;
      uVar36 = uVar40 & 1;
      uVar32 = (ulong)uVar36;
      iVar20 = *(int *)((long)&search[2].name + (ulong)uVar36 * 4);
      puVar31 = *(undefined8 **)(search[2].type + (ulong)uVar36 * 8);
      *(int *)&search[3].field_0x6c = *(int *)&search[3].field_0x6c + iVar20;
      if (0 < iVar20) {
        iVar20 = iVar20 + 1;
        iVar35 = -0x20000000;
        do {
          phVar50 = (hmm_t *)*puVar31;
          iVar23 = hmm_vit_eval(phVar50);
          if (phVar50->frame != uVar40) {
            __assert_fail("hmm_frame(&hmm->hmm) == frame_idx",
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                          ,0x27c,"int32 eval_nonroot_chan(ngram_search_t *, int)");
          }
          puVar31 = puVar31 + 1;
          if (iVar35 < iVar23) {
            iVar35 = iVar23;
          }
          iVar20 = iVar20 + -1;
        } while (1 < iVar20);
      }
      if (*(int *)&search[3].last_link < iVar35) {
        *(int *)&search[3].last_link = iVar35;
      }
      iVar20 = *(int *)((long)&search[2].config + uVar32 * 4);
      if (iVar20 < 1) {
        iVar47 = -0x20000000;
        iVar35 = 0;
      }
      else {
        ppStack_490 = (&(search[2].pls)->vt)[uVar32];
        iVar47 = -0x20000000;
        iVar35 = 0;
        do {
          uVar36 = *(uint *)&ppStack_490->start;
          uVar25 = uVar36 + 0x1f;
          if (-1 < (long)(int)uVar36) {
            uVar25 = uVar36;
          }
          uVar22 = *(uint *)(*(long *)&search[1].post + (long)((int)uVar25 >> 5) * 4);
          if ((uVar22 >> (uVar36 & 0x1f) & 1) == 0) {
            __assert_fail("bitvec_is_set(ngs->word_active, w)",
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                          ,0x291,"int32 eval_word_chan(ngram_search_t *, int)");
          }
          *(uint *)(*(long *)&search[1].post + (long)((int)uVar25 >> 5) * 4) =
               uVar22 & ~(uint)(1L << ((byte)uVar36 & 0x1f));
          phVar50 = (hmm_t *)(&(search[1].last_link)->from)[(int)uVar36];
          if (phVar50 == (hmm_t *)0x0) {
            __assert_fail("ngs->word_chan[w] != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                          ,0x293,"int32 eval_word_chan(ngram_search_t *, int)");
          }
          ppStack_490 = (ps_searchfuncs_t *)((long)&ppStack_490->start + 4);
          do {
            if (phVar50->frame != uVar40) {
              __assert_fail("hmm_frame(&hmm->hmm) == frame_idx",
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                            ,0x298,"int32 eval_word_chan(ngram_search_t *, int)");
            }
            iVar23 = hmm_vit_eval(phVar50);
            if (iVar47 < iVar23) {
              iVar47 = iVar23;
            }
            iVar35 = iVar35 + 1;
            phVar50 = (hmm_t *)phVar50[1].ctx;
          } while (phVar50 != (hmm_t *)0x0);
          bVar18 = 1 < iVar20;
          iVar20 = iVar20 + -1;
        } while (bVar18);
      }
      if (*(int *)&search[2].vt < 1) {
        iVar20 = 0;
      }
      else {
        lVar37 = 0;
        iVar20 = 0;
        do {
          iVar45 = *(int *)(*(long *)&search[1].finish_wid + lVar37 * 4);
          phVar50 = (hmm_t *)(&(search[1].last_link)->from)[iVar45];
          if ((int)uVar40 <= phVar50->frame) {
            iVar23 = hmm_vit_eval(phVar50);
            if ((iVar47 < iVar23) && (iVar45 != search->finish_wid)) {
              iVar47 = iVar23;
            }
            iVar20 = iVar20 + 1;
          }
          lVar37 = lVar37 + 1;
        } while (lVar37 < *(int *)&search[2].vt);
      }
      uVar40 = uStack_46c;
      *(int *)&search[4].vt = *(int *)&search[4].vt + iVar35 + iVar20;
      iVar35 = iVar35 + iVar20 + *(int *)&search[3].field_0x6c;
      *(int *)&search[3].field_0x6c = iVar35;
      piVar49 = (int *)((long)&search[4].vt + 4);
      *piVar49 = *piVar49 + iVar20 + *(int *)((long)&search[2].config + uVar32 * 4);
      if (*(int *)&search[3].last_link < iVar47) {
        *(int *)&search[3].last_link = iVar47;
      }
      *(int *)((long)&search[3].last_link + 4) = iVar47;
      *(undefined4 *)&search[2].dict = 0;
      iVar20 = search[5].n_words;
      iVar47 = *(int *)((long)&search[6].config + 4);
      search[5].start_wid = iVar20;
      if ((iVar47 != -1) && (iVar47 < iVar35 + search[3].finish_wid)) {
        iVar35 = iVar20 + 0xff;
        if (-1 < iVar20) {
          iVar35 = iVar20;
        }
        iVar35 = -(iVar35 >> 8);
        memset(aiStack_438,0,0x400);
        iVar20 = *(int *)((long)&search[1].d2p + 4);
        if (0 < iVar20) {
          iVar45 = *(int *)&search[3].last_link;
          piVar49 = (int *)&search[1].dict[1].field_0x4;
          do {
            iVar24 = (iVar45 - *piVar49) / iVar35;
            if (0xfe < iVar24) {
              iVar24 = 0xff;
            }
            aiStack_438[iVar24] = aiStack_438[iVar24] + 1;
            piVar49 = piVar49 + 0x1c;
            iVar20 = iVar20 + -1;
          } while (iVar20 != 0);
        }
        iVar20 = *(int *)((long)&search[2].name + (ulong)(uVar40 & 1) * 4);
        if (0 < iVar20) {
          plVar41 = *(long **)(search[2].type + (ulong)(uVar40 & 1) * 8);
          iVar45 = *(int *)&search[3].last_link;
          iVar20 = iVar20 + 1;
          do {
            iVar24 = (iVar45 - *(int *)(*plVar41 + 0x44)) / iVar35;
            if (0xfe < iVar24) {
              iVar24 = 0xff;
            }
            aiStack_438[iVar24] = aiStack_438[iVar24] + 1;
            plVar41 = plVar41 + 1;
            iVar20 = iVar20 + -1;
          } while (1 < iVar20);
        }
        lVar37 = 0;
        iVar20 = 0;
        do {
          iVar20 = iVar20 + aiStack_438[lVar37];
          if (iVar47 < iVar20) goto LAB_0013aaac;
          lVar37 = lVar37 + 1;
        } while (lVar37 != 0x100);
        lVar37 = 0x100;
LAB_0013aaac:
        search[5].start_wid = -(iVar35 * (int)lVar37);
      }
      uVar36 = uVar40 + 1;
      uStack_450 = (ulong)(uVar36 & 1);
      puVar31 = *(undefined8 **)(search[2].type + uStack_450 * 8);
      if (0 < *(int *)((long)&search[1].d2p + 4)) {
        iVar20 = *(int *)&search[3].last_link;
        iVar47 = search[5].start_wid + iVar20;
        iVar35 = search[5].silence_wid + iVar20;
        ppVar8 = search->pls;
        pdVar26 = search[1].dict;
        iVar45 = 0;
        uStack_460 = CONCAT44(uStack_460._4_4_,iVar20 + *(int *)&search[5].field_0x6c);
        puStack_468 = (uint *)CONCAT44(puStack_468._4_4_,iVar47);
        do {
          if (((int)uVar40 <= *(int *)((long)&pdVar26[1].mdef + 4)) &&
             (iVar47 < *(int *)&pdVar26[1].field_0x4)) {
            *(uint *)((long)&pdVar26[1].mdef + 4) = uVar36;
            iVar20 = *(int *)((long)&search[6].pls + 4) + pdVar26->startwid;
            if ((ppVar8 != (ps_search_t *)0x0) || (iVar35 < iVar20)) {
              for (phVar50 = (hmm_t *)pdVar26[1].ht; phVar50 != (hmm_t *)0x0;
                  phVar50 = *(hmm_t **)phVar50[1].score) {
                if (ppVar8 == (ps_search_t *)0x0) {
                  iVar47 = 0;
                }
                else {
                  iVar47 = *(int *)((long)&(ppVar8[1].acmod)->config + (long)phVar50[1].score[2] * 4
                                   );
                }
                if ((iVar35 < iVar47 + iVar20) &&
                   ((phVar50->frame < (int)uVar40 || (phVar50->score[0] < iVar20)))) {
                  hmm_enter(phVar50,iVar20,pdVar26->finishwid,uVar36);
                  *puVar31 = phVar50;
                  puVar31 = puVar31 + 1;
                }
              }
            }
            iVar47 = (int)puStack_468;
            if (((ppVar8 != (ps_search_t *)0x0) || ((int)uStack_460 < iVar20)) &&
               (uVar25 = pdVar26[1].max_words, -1 < (int)uVar25)) {
              lVar37 = *(long *)&search[1].start_wid;
              do {
                uVar32 = (ulong)uVar25;
                if (ppVar8 == (ps_search_t *)0x0) {
                  iVar24 = 0;
                }
                else {
                  pdVar9 = search->dict->word;
                  iVar24 = *(int *)((long)&(ppVar8[1].acmod)->config +
                                   (long)pdVar9[uVar32].ciphone[(long)pdVar9[uVar32].pronlen + -1] *
                                   4);
                }
                if ((int)uStack_460 < iVar24 + iVar20) {
                  paVar57 = search[2].acmod;
                  lVar44 = (long)*(int *)&search[2].dict;
                  *(int *)&search[2].dict = *(int *)&search[2].dict + 1;
                  *(uint *)(&paVar57->config + lVar44 * 2) = uVar25;
                  *(int *)((long)&paVar57->config + lVar44 * 0x10 + 4) =
                       iVar20 - *(int *)&search[6].pls;
                  *(s3wid_t *)(&paVar57->lmath + lVar44 * 2) = pdVar26->finishwid;
                }
                uVar25 = *(uint *)(lVar37 + uVar32 * 4);
              } while (-1 < (int)uVar25);
            }
          }
          iVar45 = iVar45 + 1;
          pdVar26 = (dict_t *)&pdVar26[1].startwid;
        } while (iVar45 < *(int *)((long)&search[1].d2p + 4));
      }
      pcVar10 = search[2].type;
      lVar37 = *(long *)(pcVar10 + uStack_450 * 8);
      iVar20 = (int)((ulong)((long)puVar31 - lVar37) >> 3);
      *(int *)((long)&search[2].name + uStack_450 * 4) = iVar20;
      uStack_440 = (ulong)(uVar40 & 1);
      puStack_480 = (undefined8 *)(lVar37 + (long)iVar20 * 8);
      uVar25 = *(uint *)((long)&search[2].name + uStack_440 * 4);
      if (0 < (int)uVar25) {
        iVar20 = *(int *)&search[3].last_link;
        uStack_460 = CONCAT44(uStack_460._4_4_,search[5].start_wid + iVar20);
        iVar47 = search[5].silence_wid + iVar20;
        puVar31 = *(undefined8 **)(pcVar10 + uStack_440 * 8);
        ppVar8 = search->pls;
        ppStack_458 = (ps_searchfuncs_t *)
                      CONCAT44(ppStack_458._4_4_,iVar20 + *(int *)&search[5].field_0x6c);
        do {
          puVar54 = (uint *)(ulong)uVar25;
          phVar50 = (hmm_t *)*puVar31;
          uVar25 = phVar50->frame;
          if ((int)uVar25 < (int)uVar40) {
            __assert_fail("hmm_frame(&hmm->hmm) >= frame_idx",
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                          ,0x335,"void prune_nonroot_chan(ngram_search_t *, int)");
          }
          if ((int)uStack_460 < phVar50->bestscore) {
            if (uVar25 != uVar36) {
              phVar50->frame = uVar36;
              *puStack_480 = phVar50;
              puStack_480 = puStack_480 + 1;
            }
            iVar20 = *(int *)((long)&search[6].pls + 4) + phVar50->out_score;
            puStack_468 = puVar54;
            if ((ppVar8 != (ps_search_t *)0x0) || (iVar47 < iVar20)) {
              for (phVar51 = (hmm_t *)phVar50[1].ctx; phVar51 != (hmm_t *)0x0;
                  phVar51 = *(hmm_t **)phVar51[1].score) {
                if (ppVar8 == (ps_search_t *)0x0) {
                  iVar35 = 0;
                }
                else {
                  iVar35 = *(int *)((long)&(ppVar8[1].acmod)->config + (long)phVar51[1].score[2] * 4
                                   );
                }
                if ((iVar47 < iVar35 + iVar20) &&
                   ((phVar51->frame < (int)uVar40 || (phVar51->score[0] < iVar20)))) {
                  if (phVar51->frame != uVar36) {
                    *puStack_480 = phVar51;
                    puStack_480 = puStack_480 + 1;
                  }
                  hmm_enter(phVar51,iVar20,phVar50->out_history,uVar36);
                }
              }
            }
            puVar54 = puStack_468;
            if (((ppVar8 != (ps_search_t *)0x0) || ((int)ppStack_458 < iVar20)) &&
               (uVar25 = phVar50[1].score[3], -1 < (int)uVar25)) {
              lVar37 = *(long *)&search[1].start_wid;
              do {
                uVar32 = (ulong)uVar25;
                if (ppVar8 == (ps_search_t *)0x0) {
                  iVar35 = 0;
                }
                else {
                  pdVar9 = search->dict->word;
                  iVar35 = *(int *)((long)&(ppVar8[1].acmod)->config +
                                   (long)pdVar9[uVar32].ciphone[(long)pdVar9[uVar32].pronlen + -1] *
                                   4);
                }
                if ((int)ppStack_458 < iVar35 + iVar20) {
                  paVar57 = search[2].acmod;
                  lVar44 = (long)*(int *)&search[2].dict;
                  *(int *)&search[2].dict = *(int *)&search[2].dict + 1;
                  *(uint *)(&paVar57->config + lVar44 * 2) = uVar25;
                  *(int *)((long)&paVar57->config + lVar44 * 0x10 + 4) =
                       iVar20 - *(int *)&search[6].pls;
                  *(int32 *)(&paVar57->lmath + lVar44 * 2) = phVar50->out_history;
                }
                uVar25 = *(uint *)(lVar37 + uVar32 * 4);
              } while (-1 < (int)uVar25);
            }
          }
          else if (uVar25 != uVar36) {
            hmm_clear(phVar50);
          }
          puVar31 = puVar31 + 1;
          uVar25 = (int)puVar54 - 1;
        } while (1 < (int)puVar54);
      }
      uVar32 = (ulong)(uint)((int)uStack_450 * 8);
      *(int *)((long)&search[2].name + uStack_450 * 4) =
           (int)((ulong)((long)puStack_480 - *(long *)(search[2].type + uVar32)) >> 3);
      puStack_468 = *(uint **)((long)&(search[2].pls)->vt + uVar32);
      iVar20 = *(int *)&search[2].dict;
      *(int *)&search[4].type = *(int *)&search[4].type + iVar20;
      if (iVar20 < 1) {
        uVar25 = 0;
      }
      else {
        paVar57 = search[2].acmod;
        iVar20 = 0;
        uVar25 = 0;
        do {
          if ((long)*(int *)&paVar57->lmath != -1) {
            pbVar53 = (bptbl_t *)((long)*(int *)&paVar57->lmath * 0x24 + *(long *)&search[2].post);
            iVar23 = ngram_search_exit_score
                               ((ngram_search_t *)search,pbVar53,
                                (int)*search->dict->word[*(int *)&paVar57->config].ciphone);
            if (iVar23 < -0x1fffffff) {
              __assert_fail("start_score BETTER_THAN WORST_SCORE",
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                            ,0x392,"void last_phone_transition(ngram_search_t *, int)");
            }
            piVar49 = (int *)((long)&paVar57->config + 4);
            *piVar49 = *piVar49 - iVar23;
            if ((&(search[2].d2p)->refcount)[(long)*(int *)&paVar57->config * 3] !=
                pbVar53->frame + 1) {
              if (0 < (int)uVar25) {
                uVar32 = 0;
                do {
                  if ((&(search[2].dag)->refcount)[uVar32 * 2] == pbVar53->frame) {
                    *(undefined4 *)((long)&paVar57->lmath + 4) =
                         *(undefined4 *)(&(search[2].dag)->field_0x4 + uVar32 * 8);
                    uVar22 = (uint)uVar32;
                    goto LAB_0013b055;
                  }
                  uVar32 = uVar32 + 1;
                } while (uVar25 != uVar32);
              }
              iVar47 = *(int *)&search[2].hyp_str;
              if (iVar47 <= (int)uVar25) {
                if (iVar47 == 0) {
                  ppVar29 = (ps_lattice_t *)
                            __ckd_calloc__(0x20,8,
                                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                                           ,0x3ab);
                  search[2].dag = ppVar29;
                  *(undefined4 *)&search[2].hyp_str = 0x20;
                }
                else {
                  *(int *)&search[2].hyp_str = iVar47 + 0x20;
                  ppVar29 = (ps_lattice_t *)
                            __ckd_realloc__(search[2].dag,(long)iVar47 * 8 + 0x100,
                                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                                            ,0x3b2);
                  search[2].dag = ppVar29;
                  err_msg(ERR_INFO,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                          ,0x3b4,"cand_sf[] increased to %d entries\n",
                          (ulong)*(uint *)&search[2].hyp_str);
                }
              }
              *(undefined4 *)((long)&paVar57->lmath + 4) = 0xffffffff;
              (&(search[2].dag)->refcount)[(long)(int)uVar25 * 2] = pbVar53->frame;
              uVar22 = uVar25;
              uVar25 = uVar25 + 1;
LAB_0013b055:
              *(int *)(&(search[2].dag)->field_0x4 + (long)(int)uVar22 * 8) = iVar20;
              pdVar11 = search[2].d2p;
              iVar47 = *(int *)&paVar57->config;
              *(undefined4 *)(&pdVar11->field_0x4 + (long)iVar47 * 0xc) = 0xe0000000;
              (&pdVar11->refcount)[(long)iVar47 * 3] = pbVar53->frame + 1;
            }
          }
          iVar20 = iVar20 + 1;
          paVar57 = (acmod_t *)&paVar57->strings;
        } while (iVar20 < *(int *)&search[2].dict);
      }
      if (0 < (int)uVar25) {
        uStack_460 = (ulong)uVar25;
        uVar32 = 0;
        do {
          lVar37 = (long)(&(search[2].dag)->refcount)[uVar32 * 2];
          iVar20 = *(int *)(search[3].name + lVar37 * 4);
          iVar47 = *(int *)(search[3].name + lVar37 * 4 + 4);
          if (iVar20 < iVar47) {
            pbVar53 = (bptbl_t *)((long)iVar20 * 0x24 + *(long *)&search[2].post);
            do {
              if (pbVar53->valid != '\0') {
                uVar25 = *(uint *)(&(search[2].dag)->field_0x4 + uVar32 * 8);
                while (-1 < (int)uVar25) {
                  pppVar2 = &(search[2].acmod)->config + (ulong)uVar25 * 2;
                  iVar23 = ngram_search_exit_score
                                     ((ngram_search_t *)search,pbVar53,
                                      (int)*search->dict->word
                                            [*(int *)(&(search[2].acmod)->config + (ulong)uVar25 * 2
                                                     )].ciphone);
                  if (-0x20000000 < iVar23) {
                    iVar35 = dict_filler_word(search->dict,*(s3wid_t *)pppVar2);
                    if (iVar35 != 0) {
                      __assert_fail("!dict_filler_word(ps_search_dict(ngs), candp->wid)",
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                                    ,0x3d5,"void last_phone_transition(ngram_search_t *, int)");
                    }
                    iVar21 = ngram_tg_score((ngram_model_t *)search[1].vt,
                                            search->dict->word[*(int *)pppVar2].basewid,
                                            pbVar53->real_wid,pbVar53->prev_real_wid,aiStack_438);
                    iVar23 = iVar23 + (iVar21 >> 10);
                  }
                  pdVar11 = search[2].d2p;
                  lVar37 = (long)*(int *)pppVar2;
                  if (*(int *)(&pdVar11->field_0x4 + lVar37 * 0xc) < iVar23) {
                    *(int32 *)(&pdVar11->field_0x4 + lVar37 * 0xc) = iVar23;
                    *(int *)((long)&pdVar11->mdef + lVar37 * 0xc) = iVar20;
                  }
                  uVar25 = *(uint *)((long)pppVar2 + 0xc);
                }
              }
              iVar20 = iVar20 + 1;
              pbVar53 = pbVar53 + 1;
            } while (iVar20 != iVar47);
          }
          uVar32 = uVar32 + 1;
        } while (uVar32 != uStack_460);
      }
      iVar20 = *(int *)((long)&search[3].last_link + 4);
      paVar57 = search[2].acmod;
      iVar47 = *(int *)&search[2].dict;
      if (0 < iVar47) {
        pdVar11 = search[2].d2p;
        paVar42 = paVar57;
        iVar35 = iVar47;
        do {
          iVar45 = *(int *)&paVar42->config;
          iVar24 = *(int *)((long)&paVar42->config + 4) +
                   *(int *)(&pdVar11->field_0x4 + (long)iVar45 * 0xc);
          *(int *)((long)&paVar42->config + 4) = iVar24;
          *(undefined4 *)&paVar42->lmath =
               *(undefined4 *)((long)&pdVar11->mdef + (long)iVar45 * 0xc);
          if (iVar20 < iVar24) {
            iVar20 = iVar24;
          }
          paVar42 = (acmod_t *)&paVar42->strings;
          iVar35 = iVar35 + -1;
        } while (iVar35 != 0);
      }
      iVar35 = *(int *)&search[6].vt;
      *(int *)((long)&search[3].last_link + 4) = iVar20;
      if (0 < iVar47) {
        do {
          if (iVar35 + iVar20 < *(int *)((long)&paVar57->config + 4)) {
            uVar25 = *(uint *)&paVar57->config;
            ngram_search_alloc_all_rc((ngram_search_t *)search,uVar25);
            phVar50 = (hmm_t *)(&(search[1].last_link)->from)[(int)uVar25];
            if (phVar50 != (hmm_t *)0x0) {
              iVar45 = 0;
              do {
                if ((phVar50->frame < (int)uVar40) ||
                   (phVar50->score[0] < *(int *)((long)&paVar57->config + 4))) {
                  if (phVar50->frame == uVar36) {
                    __assert_fail("hmm_frame(&hmm->hmm) != nf",
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                                  ,0x3fc,"void last_phone_transition(ngram_search_t *, int)");
                  }
                  hmm_enter(phVar50,*(int32 *)((long)&paVar57->config + 4),*(int32 *)&paVar57->lmath
                            ,uVar36);
                  iVar45 = iVar45 + 1;
                }
                phVar50 = (hmm_t *)phVar50[1].ctx;
              } while (phVar50 != (hmm_t *)0x0);
              if (0 < iVar45) {
                uVar22 = uVar25 + 0x1f;
                if (-1 < (int)uVar25) {
                  uVar22 = uVar25;
                }
                lVar37 = *(long *)&search[1].post;
                if ((*(uint *)(lVar37 + (long)((int)uVar22 >> 5) * 4) >> (uVar25 & 0x1f) & 1) != 0)
                {
                  __assert_fail("bitvec_is_clear(ngs->word_active, w)",
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                                ,0x403,"void last_phone_transition(ngram_search_t *, int)");
                }
                if (search->dict->word[(int)uVar25].pronlen == 1) {
                  __assert_fail("!dict_is_single_phone(ps_search_dict(ngs), w)",
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                                ,0x404,"void last_phone_transition(ngram_search_t *, int)");
                }
                *puStack_468 = uVar25;
                puStack_468 = puStack_468 + 1;
                puVar54 = (uint *)(lVar37 + (long)((int)uVar22 >> 5) * 4);
                *puVar54 = *puVar54 | (uint)(1L << ((byte)uVar25 & 0x1f));
              }
            }
          }
          paVar57 = (acmod_t *)&paVar57->strings;
          bVar18 = 1 < iVar47;
          iVar47 = iVar47 + -1;
        } while (bVar18);
      }
      ppVar8 = search[2].pls;
      ppVar46 = (&ppVar8->vt)[uStack_450];
      iVar35 = (int)((ulong)((long)puStack_468 - (long)ppVar46) >> 2);
      *(int *)((long)&search[2].config + uStack_450 * 4) = iVar35;
      iVar20 = *(int *)((long)&search[3].last_link + 4);
      iVar47 = search[5].finish_wid + iVar20;
      iVar20 = iVar20 + *(int *)&search[6].vt;
      puStack_448 = (uint *)((long)&ppVar46->start + (long)iVar35 * 4);
      uVar25 = *(uint *)((long)&search[2].config + uStack_440 * 4);
      if (0 < (int)uVar25) {
        ppVar46 = (&ppVar8->vt)[uStack_440];
        do {
          uVar32 = (ulong)(int)*(uint *)&ppVar46->start;
          phVar50 = (hmm_t *)(&(search[1].last_link)->from)[uVar32];
          uVar22 = uVar25;
          if (phVar50 != (hmm_t *)0x0) {
            phVar51 = (hmm_t *)(&(search[1].last_link)->from + uVar32);
            iVar35 = 0;
            puStack_468 = (uint *)(ulong)uVar25;
            uStack_460 = (ulong)*(uint *)&ppVar46->start;
            ppStack_458 = ppVar46;
            uStack_440 = uVar32;
            do {
              if (phVar50->frame < (int)uVar40) {
                __assert_fail("hmm_frame(&hmm->hmm) >= frame_idx",
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                              ,0x428,"void prune_word_chan(ngram_search_t *, int)");
              }
              phVar19 = phVar50 + 1;
              phVar12 = (hmm_t *)phVar50[1].ctx;
              if (iVar20 < phVar50->bestscore) {
                phVar50->frame = uVar36;
                iVar35 = iVar35 + 1;
                if (iVar47 < phVar50->out_score) {
                  ngram_search_save_bp
                            ((ngram_search_t *)search,uVar40,(int32)uStack_460,phVar50->out_score,
                             phVar50->out_history,phVar50[1].score[3]);
                }
              }
              else if (phVar50->frame != uVar36) {
                hmm_deinit(phVar50);
                __listelem_free__((listelem_alloc_t *)search[1].pls,phVar50,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                                  ,0x43f);
                phVar51->ctx = (hmm_context_t *)phVar12;
                phVar19 = phVar51;
              }
              phVar51 = phVar19;
              phVar50 = phVar12;
            } while (phVar12 != (hmm_t *)0x0);
            uVar22 = (uint)puStack_468;
            ppVar46 = ppStack_458;
            if (0 < iVar35) {
              uVar25 = (uint)uStack_460;
              uVar30 = uVar25 + 0x1f;
              if (-1 < (int)uVar25) {
                uVar30 = uVar25;
              }
              lVar37 = *(long *)&search[1].post;
              if ((*(uint *)(lVar37 + (long)((int)uVar30 >> 5) * 4) >> (uVar25 & 0x1f) & 1) == 0) {
                if (search->dict->word[uStack_440].pronlen == 1) {
                  __assert_fail("!dict_is_single_phone(ps_search_dict(ngs), w)",
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                                ,0x444,"void prune_word_chan(ngram_search_t *, int)");
                }
                *puStack_448 = uVar25;
                puStack_448 = puStack_448 + 1;
                puVar54 = (uint *)(lVar37 + (long)((int)uVar30 >> 5) * 4);
                *puVar54 = *puVar54 | (uint)(1L << ((byte)uStack_460 & 0x1f));
              }
            }
          }
          ppVar46 = (ps_searchfuncs_t *)((long)&ppVar46->start + 4);
          uVar25 = uVar22 - 1;
        } while (1 < (int)uVar22);
      }
      *(int *)((long)&search[2].config + uStack_450 * 4) =
           (int)((ulong)((long)puStack_448 - (long)(&(search[2].pls)->vt)[uStack_450]) >> 2);
      if (0 < *(int *)&search[2].vt) {
        lVar37 = 0;
        do {
          iVar35 = *(int *)(*(long *)&search[1].finish_wid + lVar37 * 4);
          ppVar13 = (&(search[1].last_link)->from)[iVar35];
          if (((int)uVar40 <= ppVar13[1].wid) && (iVar20 < *(int *)((long)&ppVar13->next + 4))) {
            ppVar13[1].wid = uVar36;
            if (iVar47 < *(int *)&ppVar13->entries) {
              ngram_search_save_bp
                        ((ngram_search_t *)search,uVar40,iVar35,*(int *)&ppVar13->entries,
                         *(int32 *)((long)&ppVar13->entries + 4),0);
            }
          }
          lVar37 = lVar37 + 1;
        } while (lVar37 < *(int *)&search[2].vt);
      }
      if ((*(int *)&search[6].config != -1) && (*(int *)&search[6].config != search->n_words)) {
        lVar37 = (long)(int)uStack_46c;
        lVar44 = (long)*(int *)(search[3].name + lVar37 * 4);
        iVar20 = search[2].start_wid;
        if (*(int *)(search[3].name + lVar37 * 4) < iVar20) {
          lVar39 = lVar44 * 0x24;
          ppStack_490 = (ps_searchfuncs_t *)0x0;
          iVar35 = -0x80000000;
          iVar47 = 0;
          do {
            lVar59 = *(long *)&search[2].post;
            iVar20 = dict_filler_word(search->dict,*(s3wid_t *)(lVar59 + 8 + lVar39));
            if (iVar20 != 0) {
              iVar20 = *(int *)(lVar59 + 0x10 + lVar39);
              if (iVar35 < iVar20) {
                ppStack_490 = (ps_searchfuncs_t *)(lVar59 + lVar39);
                iVar35 = iVar20;
              }
              *(undefined1 *)(lVar59 + 4 + lVar39) = 0;
              iVar47 = iVar47 + 1;
            }
            lVar44 = lVar44 + 1;
            iVar20 = search[2].start_wid;
            lVar39 = lVar39 + 0x24;
          } while (lVar44 < iVar20);
        }
        else {
          iVar47 = 0;
          ppStack_490 = (ps_searchfuncs_t *)0x0;
        }
        if (ppStack_490 != (ps_searchfuncs_t *)0x0) {
          *(undefined1 *)((long)ppStack_490 + 4) = 1;
          iVar47 = iVar47 + -1;
        }
        iVar35 = *(int *)(search[3].name + lVar37 * 4);
        iVar47 = (iVar20 - iVar35) - iVar47;
        iVar45 = *(int *)&search[6].config;
        if (iVar45 < iVar47) {
          do {
            if (iVar35 < iVar20) {
              lVar39 = *(long *)&search[2].post + (long)iVar35 * 0x24;
              iVar24 = 0x7fffffff;
              lVar37 = 0;
              lVar44 = (long)iVar20 - (long)iVar35;
              do {
                if ((*(char *)(lVar39 + 4) != '\0') && (*(int *)(lVar39 + 0x10) < iVar24)) {
                  lVar37 = lVar39;
                  iVar24 = *(int *)(lVar39 + 0x10);
                }
                lVar39 = lVar39 + 0x24;
                lVar44 = lVar44 + -1;
              } while (lVar44 != 0);
            }
            else {
              lVar37 = 0;
            }
            if (lVar37 == 0) {
              err_msg(ERR_FATAL,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                      ,0x4d3,"PANIC: No worst BPtable entry remaining\n");
              exit(1);
            }
            *(undefined1 *)(lVar37 + 4) = 0;
            iVar47 = iVar47 + -1;
          } while (iVar45 < iVar47);
        }
      }
      uVar40 = uStack_46c;
      puVar54 = (uint *)(long)(int)uStack_46c;
      pdVar26 = search->dict;
      pdVar11 = search->d2p;
      pbVar14 = search->acmod->mdef;
      lVar37 = (long)pbVar14->n_ciphone;
      if (0 < lVar37) {
        lVar44 = lVar37 + 1;
        puVar34 = (undefined4 *)((long)&(search[2].last_link)->from + lVar37 * 0xc);
        do {
          puVar34 = puVar34 + -3;
          *puVar34 = 0xe0000000;
          lVar44 = lVar44 + -1;
        } while (1 < lVar44);
      }
      lVar37 = (long)*(int *)(search[3].name + (long)puVar54 * 4);
      if (*(int *)(search[3].name + (long)puVar54 * 4) < search[2].start_wid) {
        ppVar8 = search->pls;
        lVar44 = *(long *)&search[2].post;
        ppVar15 = search[3].pls;
        iVar20 = 0;
        do {
          *(undefined4 *)((long)&ppVar15->vt + (long)*(int *)(lVar44 + 8 + lVar37 * 0x24) * 4) =
               0xffffffff;
          if (*(int *)(lVar44 + 8 + lVar37 * 0x24) != search->finish_wid) {
            lVar39 = lVar44 + lVar37 * 0x24;
            iVar20 = iVar20 + 1;
            if ((long)*(short *)(lVar39 + 0x22) == -1) {
              iVar47 = pbVar14->n_ciphone;
              if (0 < (long)iVar47) {
                iVar35 = *(int *)(lVar39 + 0x10);
                ppVar58 = search[2].last_link;
                lVar59 = 0;
                do {
                  if (*(int *)((long)&ppVar58->from + lVar59) < iVar35) {
                    *(int *)((long)&ppVar58->from + lVar59) = iVar35;
                    *(int *)((long)&ppVar58->from + lVar59 + 4) = (int)lVar37;
                    *(int *)((long)&ppVar58->to + lVar59) = (int)*(short *)(lVar39 + 0x20);
                  }
                  lVar59 = lVar59 + 0xc;
                } while ((long)iVar47 * 0xc != lVar59);
              }
            }
            else {
              iVar47 = pbVar14->n_ciphone;
              if (0 < (long)iVar47) {
                iVar35 = *(int *)(lVar39 + 0x14);
                lVar59 = *(long *)&search[2].finish_wid;
                sVar4 = *(short *)(lVar39 + 0x20);
                psVar16 = pdVar11->rssid[(int)sVar4][*(short *)(lVar39 + 0x22)].cimap;
                ppVar58 = search[2].last_link;
                lVar39 = 0;
                do {
                  iVar45 = *(int *)((long)iVar35 * 4 + lVar59 + (long)psVar16[lVar39] * 4);
                  if (*(int *)&ppVar58->from < iVar45) {
                    *(int *)&ppVar58->from = iVar45;
                    *(int *)((long)&ppVar58->from + 4) = (int)lVar37;
                    *(int *)&ppVar58->to = (int)sVar4;
                  }
                  lVar39 = lVar39 + 1;
                  ppVar58 = (ps_latlink_t *)((long)&ppVar58->to + 4);
                } while (iVar47 != lVar39);
              }
            }
          }
          lVar37 = lVar37 + 1;
        } while (lVar37 < search[2].start_wid);
        if (iVar20 != 0) {
          iVar35 = uStack_46c + 1;
          iVar20 = *(int *)((long)&search[1].d2p + 4);
          iVar47 = search[5].start_wid + *(int *)&search[3].last_link;
          uStack_460 = CONCAT44(uStack_460._4_4_,iVar47);
          if (0 < iVar20) {
            phVar50 = (hmm_t *)search[1].dict;
            iVar20 = iVar20 + 1;
            do {
              lVar37 = (long)(short)phVar50[1].score[2];
              if (ppVar8 == (ps_search_t *)0x0) {
                iVar45 = 0;
              }
              else {
                iVar45 = *(int *)((long)&(ppVar8[1].acmod)->config + lVar37 * 4);
              }
              ppVar58 = search[2].last_link;
              iVar24 = *(int *)&search[6].pls + *(int *)((long)&ppVar58->from + lVar37 * 0xc) +
                       *(int *)((long)&search[6].pls + 4);
              if ((iVar47 < iVar45 + iVar24) &&
                 ((phVar50->frame < (int)uVar40 || (phVar50->score[0] < iVar24)))) {
                hmm_enter(phVar50,iVar24,*(int32 *)((long)&ppVar58->from + lVar37 * 0xc + 4),iVar35)
                ;
                sVar5 = pdVar11->ldiph_lc[(short)phVar50[1].score[2]]
                        [*(short *)((long)phVar50[1].score + 10)]
                        [*(int *)((long)&ppVar58->to + lVar37 * 0xc)];
                phVar50->senid[0] = sVar5;
                iVar47 = (int)uStack_460;
                if (sVar5 == 0xffff) {
                  __assert_fail("hmm_mpx_ssid(&rhmm->hmm, 0) != BAD_SSID",
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                                ,0x52e,"void word_transition(ngram_search_t *, int)");
                }
              }
              phVar50 = (hmm_t *)(phVar50[1].score + 4);
              iVar20 = iVar20 + -1;
            } while (1 < iVar20);
          }
          ppStack_458 = (ps_searchfuncs_t *)CONCAT44(ppStack_458._4_4_,iVar35);
          lVar37 = (long)*(int *)((long)&search[2].vt + 4);
          if (0 < lVar37) {
            lVar44 = *(long *)&search[1].finish_wid;
            pdVar17 = search[2].d2p;
            lVar39 = 0;
            do {
              *(undefined4 *)(&pdVar17->field_0x4 + (long)*(int *)(lVar44 + lVar39 * 4) * 0xc) =
                   0x80000000;
              lVar39 = lVar39 + 1;
            } while (lVar37 != lVar39);
          }
          lVar37 = (long)*(int *)(search[3].name + (long)puVar54 * 4);
          puStack_468 = puVar54;
          if (*(int *)(search[3].name + (long)puVar54 * 4) < search[2].start_wid) {
            do {
              if ((*(char *)(*(long *)&search[2].post + 4 + lVar37 * 0x24) != '\0') &&
                 (0 < *(int *)((long)&search[2].vt + 4))) {
                pbVar53 = (bptbl_t *)(*(long *)&search[2].post + lVar37 * 0x24);
                lVar44 = 0;
                do {
                  lVar39 = (long)*(int *)(*(long *)&search[1].finish_wid + lVar44 * 4);
                  iVar23 = ngram_search_exit_score
                                     ((ngram_search_t *)search,pbVar53,
                                      (int)*pdVar26->word[lVar39].ciphone);
                  iVar20 = -0x20000000;
                  if (iVar23 != -0x20000000) {
                    iVar21 = ngram_tg_score((ngram_model_t *)search[1].vt,
                                            pdVar26->word[lVar39].basewid,pbVar53->real_wid,
                                            pbVar53->prev_real_wid,aiStack_438);
                    iVar20 = (iVar21 >> 10) + iVar23;
                  }
                  pdVar17 = search[2].d2p;
                  if (*(int *)(&pdVar17->field_0x4 + lVar39 * 0xc) < iVar20) {
                    *(int *)(&pdVar17->field_0x4 + lVar39 * 0xc) = iVar20;
                    *(int *)((long)&pdVar17->mdef + lVar39 * 0xc) = (int)lVar37;
                  }
                  lVar44 = lVar44 + 1;
                } while (lVar44 < *(int *)((long)&search[2].vt + 4));
              }
              lVar37 = lVar37 + 1;
            } while (lVar37 < search[2].start_wid);
          }
          iVar20 = (int)ppStack_458;
          iVar47 = (int)uStack_460;
          if (0 < *(int *)((long)&search[2].vt + 4)) {
            lVar37 = 0;
            do {
              iVar35 = *(int *)(*(long *)&search[1].finish_wid + lVar37 * 4);
              lVar44 = (long)iVar35;
              if (iVar35 != search->dict->startwid) {
                phVar50 = (hmm_t *)(&(search[1].last_link)->from)[lVar44];
                if (ppVar8 == (ps_search_t *)0x0) {
                  iVar35 = 0;
                }
                else {
                  iVar35 = *(int *)((long)&(ppVar8[1].acmod)->config +
                                   (long)(short)phVar50[1].score[2] * 4);
                }
                iVar45 = *(int *)((long)&search[6].pls + 4) +
                         *(int *)(&(search[2].d2p)->field_0x4 + lVar44 * 0xc);
                if (iVar47 < iVar35 + iVar45) {
                  lVar39 = *(long *)&search[2].post;
                  iVar35 = *(int *)((long)&(search[2].d2p)->mdef + lVar44 * 0xc);
                  if ((phVar50->frame < (int)puStack_468) || (phVar50->score[0] < iVar45)) {
                    hmm_enter(phVar50,iVar45,iVar35,iVar20);
                    iVar47 = *(int *)(lVar39 + 8 + (long)iVar35 * 0x24);
                    uVar3 = pdVar11->ldiph_lc[(short)phVar50[1].score[2]]
                            [*(short *)((long)phVar50[1].score + 10)]
                            [pdVar26->word[iVar47].ciphone[(long)pdVar26->word[iVar47].pronlen + -1]
                            ];
                    phVar50->senid[0] = uVar3;
                    iVar47 = (int)uStack_460;
                    if (uVar3 == 0xffff) {
                      __assert_fail("hmm_mpx_ssid(&rhmm->hmm, 0) != BAD_SSID",
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                                    ,0x56c,"void word_transition(ngram_search_t *, int)");
                    }
                  }
                }
              }
              lVar37 = lVar37 + 1;
            } while (lVar37 < *(int *)((long)&search[2].vt + 4));
          }
          lVar37 = (long)search->acmod->mdef->sil;
          phVar50 = (hmm_t *)(&(search[1].last_link)->from)[search->silence_wid];
          iVar35 = *(int *)&search[6].name +
                   *(int *)((long)&(search[2].last_link)->from + lVar37 * 0xc) +
                   *(int *)((long)&search[6].pls + 4);
          if (ppVar8 == (ps_search_t *)0x0) {
            iVar45 = 0;
          }
          else {
            iVar45 = *(int *)((long)&(ppVar8[1].acmod)->config +
                             (long)(short)phVar50[1].score[2] * 4);
          }
          piVar49 = (int *)((long)&(search[2].last_link)->from + lVar37 * 0xc);
          iVar24 = (int)puStack_468;
          if ((iVar47 < iVar45 + iVar35) &&
             ((phVar50->frame < iVar24 || (phVar50->score[0] < iVar35)))) {
            hmm_enter(phVar50,iVar35,piVar49[1],iVar20);
            iVar47 = (int)uStack_460;
          }
          iVar35 = pdVar26->filler_start;
          if (iVar35 <= pdVar26->filler_end) {
            lVar37 = (long)iVar35 + -1;
            do {
              if (((iVar35 != search->silence_wid) && (iVar35 != search->dict->startwid)) &&
                 (phVar50 = (hmm_t *)(&(search[1].last_link)->to)[lVar37], phVar50 != (hmm_t *)0x0))
              {
                if (ppVar8 == (ps_search_t *)0x0) {
                  iVar45 = 0;
                }
                else {
                  iVar45 = *(int *)((long)&(ppVar8[1].acmod)->config +
                                   (long)(short)phVar50[1].score[2] * 4);
                }
                score = *(int *)((long)&search[6].type + 4) + *piVar49 +
                        *(int *)((long)&search[6].pls + 4);
                if ((iVar47 < iVar45 + score) &&
                   ((phVar50->frame < iVar24 || (phVar50->score[0] < score)))) {
                  hmm_enter(phVar50,score,piVar49[1],iVar20);
                  iVar47 = (int)uStack_460;
                }
              }
              lVar37 = lVar37 + 1;
              iVar35 = iVar35 + 1;
            } while (lVar37 < pdVar26->filler_end);
          }
        }
      }
      uVar40 = uStack_46c;
      iVar20 = *(int *)((long)&search[1].d2p + 4);
      if (0 < iVar20) {
        phVar50 = (hmm_t *)search[1].dict;
        iVar20 = iVar20 + 1;
        do {
          if (phVar50->frame == uVar40) {
            hmm_clear(phVar50);
          }
          phVar50 = (hmm_t *)(phVar50[1].score + 4);
          iVar20 = iVar20 + -1;
        } while (1 < iVar20);
      }
      if (0 < *(int *)&search[2].vt) {
        lVar37 = 0;
        do {
          phVar50 = (hmm_t *)(&(search[1].last_link)->from)
                             [*(int *)(*(long *)&search[1].finish_wid + lVar37 * 4)];
          if (phVar50->frame == uVar40) {
            hmm_clear(phVar50);
          }
          lVar37 = lVar37 + 1;
        } while (lVar37 < *(int *)&search[2].vt);
      }
      piVar49 = (int *)((long)&search[3].type + 4);
      *piVar49 = *piVar49 + 1;
      iVar20 = 1;
    }
  }
  return iVar20;
}

Assistant:

static int
ngram_search_step(ps_search_t *search, int frame_idx)
{
    ngram_search_t *ngs = (ngram_search_t *)search;

    if (ngs->fwdtree)
        return ngram_fwdtree_search(ngs, frame_idx);
    else if (ngs->fwdflat)
        return ngram_fwdflat_search(ngs, frame_idx);
    else
        return -1;
}